

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

void tlstran_pipe_start(tlstran_pipe *p,nng_stream *conn,tlstran_ep *ep)

{
  nni_aio *aio;
  uint16_t uVar1;
  undefined1 local_30 [8];
  nni_iov iov;
  
  p->tls = conn;
  p->ep = ep;
  uVar1 = ep->proto;
  p->proto = uVar1;
  local_30 = (undefined1  [8])p->txlen;
  p->txlen[0] = '\0';
  p->txlen[1] = 'S';
  p->txlen[2] = 'P';
  p->txlen[3] = '\0';
  p->txlen[4] = (uint8_t)(uVar1 >> 8);
  p->txlen[5] = (uint8_t)uVar1;
  p->txlen[6] = '\0';
  p->txlen[7] = '\0';
  p->gottxhead = 0;
  p->gotrxhead = 0;
  p->wantrxhead = 8;
  p->wanttxhead = 8;
  iov.iov_buf = (void *)0x8;
  aio = &p->negoaio;
  nni_aio_set_iov(aio,1,(nni_iov *)local_30);
  nni_list_append(&ep->negopipes,p);
  nni_aio_set_timeout(aio,10000);
  nng_stream_send(p->tls,aio);
  return;
}

Assistant:

static void
tlstran_pipe_start(tlstran_pipe *p, nng_stream *conn, tlstran_ep *ep)
{
	nni_iov iov;

	p->tls   = conn;
	p->ep    = ep;
	p->proto = ep->proto;

	p->txlen[0] = 0;
	p->txlen[1] = 'S';
	p->txlen[2] = 'P';
	p->txlen[3] = 0;
	NNI_PUT16(&p->txlen[4], p->proto);
	NNI_PUT16(&p->txlen[6], 0);

	p->gotrxhead  = 0;
	p->gottxhead  = 0;
	p->wantrxhead = 8;
	p->wanttxhead = 8;
	iov.iov_len   = 8;
	iov.iov_buf   = &p->txlen[0];
	nni_aio_set_iov(&p->negoaio, 1, &iov);
	nni_list_append(&ep->negopipes, p);

	nni_aio_set_timeout(&p->negoaio, 10000); // 10 sec timeout to negotiate
	nng_stream_send(p->tls, &p->negoaio);
}